

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::StableSign(S2Point *a,S2Point *b,S2Point *c)

{
  double dVar1;
  int local_e4;
  Vector3<double> local_e0;
  Vector3<double> local_c8;
  Vector3<double> local_b0;
  double local_98;
  double max_error;
  double det;
  double kDetErrorMultiplier;
  double ca2;
  double bc2;
  double ab2;
  Vector3_d ca;
  Vector3_d bc;
  Vector3_d ab;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(bc.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)b,a);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)(ca.c_ + 2),(BasicVector<Vector3,_double,_3UL> *)c,b);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)&ab2,(BasicVector<Vector3,_double,_3UL> *)a,c);
  bc2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                  ((BasicVector<Vector3,_double,_3UL> *)(bc.c_ + 2));
  ca2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                  ((BasicVector<Vector3,_double,_3UL> *)(ca.c_ + 2));
  kDetErrorMultiplier =
       util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                 ((BasicVector<Vector3,_double,_3UL> *)&ab2);
  det = 7.176703675781937e-16;
  if ((bc2 < ca2) || (bc2 < kDetErrorMultiplier)) {
    if (ca2 < kDetErrorMultiplier) {
      Vector3<double>::CrossProd
                (&local_e0,(Vector3<double> *)(ca.c_ + 2),(Vector3<double> *)(bc.c_ + 2));
      dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)&local_e0,b);
      max_error = -dVar1;
      local_98 = sqrt(ca2 * bc2);
    }
    else {
      Vector3<double>::CrossProd(&local_c8,(Vector3<double> *)(bc.c_ + 2),(Vector3<double> *)&ab2);
      dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)&local_c8,a);
      max_error = -dVar1;
      local_98 = sqrt(bc2 * kDetErrorMultiplier);
    }
  }
  else {
    Vector3<double>::CrossProd(&local_b0,(Vector3<double> *)&ab2,(Vector3<double> *)(ca.c_ + 2));
    dVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                      ((BasicVector<Vector3,_double,_3UL> *)&local_b0,c);
    max_error = -dVar1;
    local_98 = sqrt(kDetErrorMultiplier * ca2);
  }
  local_98 = local_98 * 7.176703675781937e-16;
  if (local_98 < ABS(max_error)) {
    local_e4 = -1;
    if (0.0 < max_error) {
      local_e4 = 1;
    }
  }
  else {
    local_e4 = 0;
  }
  return local_e4;
}

Assistant:

int StableSign(const S2Point& a, const S2Point& b, const S2Point& c) {
  Vector3_d ab = b - a;
  Vector3_d bc = c - b;
  Vector3_d ca = a - c;
  double ab2 = ab.Norm2();
  double bc2 = bc.Norm2();
  double ca2 = ca.Norm2();

  // Now compute the determinant ((A-C)x(B-C)).C, where the vertices have been
  // cyclically permuted if necessary so that AB is the longest edge.  (This
  // minimizes the magnitude of cross product.)  At the same time we also
  // compute the maximum error in the determinant.  Using a similar technique
  // to the one used for kMaxDetError, the error is at most
  //
  //   |d| <= (3 + 6/sqrt(3)) * |A-C| * |B-C| * e
  //
  // where e = 0.5 * DBL_EPSILON.  If the determinant magnitude is larger than
  // this value then we know its sign with certainty.
  const double kDetErrorMultiplier = 3.2321 * DBL_EPSILON;  // see above
  double det, max_error;
  if (ab2 >= bc2 && ab2 >= ca2) {
    // AB is the longest edge, so compute (A-C)x(B-C).C.
    det = -(ca.CrossProd(bc).DotProd(c));
    max_error = kDetErrorMultiplier * sqrt(ca2 * bc2);
  } else if (bc2 >= ca2) {
    // BC is the longest edge, so compute (B-A)x(C-A).A.
    det = -(ab.CrossProd(ca).DotProd(a));
    max_error = kDetErrorMultiplier * sqrt(ab2 * ca2);
  } else {
    // CA is the longest edge, so compute (C-B)x(A-B).B.
    det = -(bc.CrossProd(ab).DotProd(b));
    max_error = kDetErrorMultiplier * sqrt(bc2 * ab2);
  }
  return (fabs(det) <= max_error) ? 0 : (det > 0) ? 1 : -1;
}